

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBarPrivate::closeTab(QTabBarPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  Tab *pTVar2;
  QWidget *pQVar3;
  int iVar4;
  QWidget *pQVar5;
  QStyle *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined4 local_3c;
  void *local_38;
  undefined4 *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar5 = (QWidget *)QObject::sender();
  pQVar6 = QWidget::style(this_00);
  iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x5c,0,this_00,0);
  lVar1 = (this->tabList).d.size;
  if (lVar1 != 0) {
    lVar7 = 0;
    do {
      pTVar2 = (this->tabList).d.ptr[lVar7];
      if (iVar4 == 0) {
        pQVar3 = pTVar2->leftWidget;
      }
      else {
        pQVar3 = pTVar2->rightWidget;
      }
      if (pQVar3 == pQVar5) {
        local_30 = &local_3c;
        local_3c = (undefined4)lVar7;
        local_38 = (void *)0x0;
        QMetaObject::activate(&this_00->super_QObject,&QTabBar::staticMetaObject,1,&local_38);
        break;
      }
      lVar7 = lVar7 + 1;
    } while (lVar1 != lVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::closeTab()
{
    Q_Q(QTabBar);
    QObject *object = q->sender();
    int tabToClose = -1;
    QTabBar::ButtonPosition closeSide = (QTabBar::ButtonPosition)q->style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, q);
    for (int i = 0; i < tabList.size(); ++i) {
        if (closeSide == QTabBar::LeftSide) {
            if (tabList.at(i)->leftWidget == object) {
                tabToClose = i;
                break;
            }
        } else {
            if (tabList.at(i)->rightWidget == object) {
                tabToClose = i;
                break;
            }
        }
    }
    if (tabToClose != -1)
        emit q->tabCloseRequested(tabToClose);
}